

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx512.cpp
# Opt level: O2

int __thiscall ncnn::Pooling_x86_avx512::create_pipeline(Pooling_x86_avx512 *this,Option *param_1)

{
  if ((this->super_Pooling).adaptive_pooling != 0) {
    (this->super_Pooling).super_Layer.support_tensor_storage = false;
    (this->super_Pooling).super_Layer.support_packing = false;
    (this->super_Pooling).super_Layer.support_bf16_storage = false;
    (this->super_Pooling).super_Layer.support_fp16_storage = false;
    (this->super_Pooling).super_Layer.support_int8_storage = false;
  }
  return 0;
}

Assistant:

int Pooling_x86_avx512::create_pipeline(const Option& /*opt*/)
{
    if (adaptive_pooling)
    {
        support_packing = false;

        support_bf16_storage = false;
        support_fp16_storage = false;
        support_int8_storage = false;
        support_tensor_storage = false;
    }
    return 0;
}